

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidSliceStaticNoParams(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  SliceStaticLayerParams *this_01;
  string *psVar6;
  long lVar7;
  ostream *poVar8;
  undefined1 local_158 [48];
  Result res4;
  undefined1 local_e0 [8];
  Result res2;
  SliceStaticLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_slicestatic(this_00);
  CoreML::Specification::SliceStaticLayerParams::add_endmasks(this_01,true);
  CoreML::validate<(MLModelType)500>((Result *)&res2.m_message._M_storage,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)&res2.m_message._M_storage);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1575);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res1).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
    res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
  }
  else {
    psVar6 = CoreML::Result::message_abi_cxx11_((Result *)&res2.m_message._M_storage);
    lVar7 = std::__cxx11::string::find((char *)psVar6,0x43ca90);
    if (lVar7 == -1) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1576);
      poVar8 = std::operator<<(poVar8,": error: ");
      poVar8 = std::operator<<(poVar8,"res1.message().find(\"Begin IDs\") != std::string::npos");
      poVar8 = std::operator<<(poVar8," was false, expected true.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
      res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
    }
    else {
      CoreML::Specification::SliceStaticLayerParams::add_beginids(this_01,0);
      CoreML::validate<(MLModelType)500>((Result *)local_e0,(Model *)&in);
      bVar1 = CoreML::Result::good((Result *)local_e0);
      if (bVar1) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157b);
        poVar8 = std::operator<<(poVar8,": error: ");
        poVar8 = std::operator<<(poVar8,"!((res2).good())");
        poVar8 = std::operator<<(poVar8," was false, expected true.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
        res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
      }
      else {
        psVar6 = CoreML::Result::message_abi_cxx11_((Result *)local_e0);
        lVar7 = std::__cxx11::string::find((char *)psVar6,0x43cae1);
        if (lVar7 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157c);
          poVar8 = std::operator<<(poVar8,": error: ");
          poVar8 = std::operator<<(poVar8,"res2.message().find(\"End IDs\") != std::string::npos");
          poVar8 = std::operator<<(poVar8," was false, expected true.");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
          res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
        }
        else {
          CoreML::Specification::SliceStaticLayerParams::add_endids(this_01,5);
          CoreML::validate<(MLModelType)500>
                    ((Result *)&res4.m_message.super__Rb_tree_node_base._M_right,(Model *)&in);
          bVar1 = CoreML::Result::good((Result *)&res4.m_message.super__Rb_tree_node_base._M_right);
          if (bVar1) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1581);
            poVar8 = std::operator<<(poVar8,": error: ");
            poVar8 = std::operator<<(poVar8,"!((res3).good())");
            poVar8 = std::operator<<(poVar8," was false, expected true.");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
            res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
          }
          else {
            psVar6 = CoreML::Result::message_abi_cxx11_
                               ((Result *)&res4.m_message.super__Rb_tree_node_base._M_right);
            lVar7 = std::__cxx11::string::find((char *)psVar6,0x43cb2e);
            if (lVar7 == -1) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar8 = std::operator<<(poVar8,":");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1582);
              poVar8 = std::operator<<(poVar8,": error: ");
              poVar8 = std::operator<<(poVar8,
                                       "res3.message().find(\"Strides\") != std::string::npos");
              poVar8 = std::operator<<(poVar8," was false, expected true.");
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              m._oneof_case_[0] = 1;
              res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
            }
            else {
              CoreML::Specification::SliceStaticLayerParams::add_strides(this_01,1);
              CoreML::validate<(MLModelType)500>((Result *)(local_158 + 0x28),(Model *)&in);
              bVar1 = CoreML::Result::good((Result *)(local_158 + 0x28));
              if (bVar1) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar8 = std::operator<<(poVar8,":");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1587);
                poVar8 = std::operator<<(poVar8,": error: ");
                poVar8 = std::operator<<(poVar8,"!((res4).good())");
                poVar8 = std::operator<<(poVar8," was false, expected true.");
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                m._oneof_case_[0] = 1;
                res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
              }
              else {
                psVar6 = CoreML::Result::message_abi_cxx11_((Result *)(local_158 + 0x28));
                lVar7 = std::__cxx11::string::find((char *)psVar6,0x43cb7b);
                if (lVar7 == -1) {
                  poVar8 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar8 = std::operator<<(poVar8,":");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1588);
                  poVar8 = std::operator<<(poVar8,": error: ");
                  poVar8 = std::operator<<(poVar8,
                                           "res4.message().find(\"Begin masks\") != std::string::npos"
                                          );
                  poVar8 = std::operator<<(poVar8," was false, expected true.");
                  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                  m._oneof_case_[0] = 1;
                  res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
                }
                else {
                  CoreML::Specification::SliceStaticLayerParams::add_beginmasks(this_01,true);
                  CoreML::Specification::SliceStaticLayerParams::clear_endmasks(this_01);
                  CoreML::validate<(MLModelType)500>((Result *)local_158,(Model *)&in);
                  bVar1 = CoreML::Result::good((Result *)local_158);
                  if (bVar1) {
                    poVar8 = std::operator<<((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                            );
                    poVar8 = std::operator<<(poVar8,":");
                    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158e);
                    poVar8 = std::operator<<(poVar8,": error: ");
                    poVar8 = std::operator<<(poVar8,"!((res5).good())");
                    poVar8 = std::operator<<(poVar8," was false, expected true.");
                    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                    m._oneof_case_[0] = 1;
                  }
                  else {
                    psVar6 = CoreML::Result::message_abi_cxx11_((Result *)local_158);
                    lVar7 = std::__cxx11::string::find((char *)psVar6,0x43cbd0);
                    if (lVar7 == -1) {
                      poVar8 = std::operator<<((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                              );
                      poVar8 = std::operator<<(poVar8,":");
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158f);
                      poVar8 = std::operator<<(poVar8,": error: ");
                      poVar8 = std::operator<<(poVar8,
                                               "res5.message().find(\"End masks\") != std::string::npos"
                                              );
                      poVar8 = std::operator<<(poVar8," was false, expected true.");
                      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                      m._oneof_case_[0] = 1;
                    }
                    else {
                      m._oneof_case_[0] = 0;
                    }
                  }
                  res2.m_message.super__Rb_tree_node_base._M_right._4_4_ = 1;
                  CoreML::Result::~Result((Result *)local_158);
                }
              }
              CoreML::Result::~Result((Result *)(local_158 + 0x28));
            }
          }
          CoreML::Result::~Result((Result *)&res4.m_message.super__Rb_tree_node_base._M_right);
        }
      }
      CoreML::Result::~Result((Result *)local_e0);
    }
  }
  CoreML::Result::~Result((Result *)&res2.m_message._M_storage);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}